

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_flttointeger(lua_Number n,lua_Integer *p,F2Imod mode)

{
  byte local_31;
  double local_30;
  lua_Number f;
  F2Imod mode_local;
  lua_Integer *p_local;
  lua_Number n_local;
  
  local_30 = floor(n);
  if ((n != local_30) || (NAN(n) || NAN(local_30))) {
    if (mode == F2Ieq) {
      return 0;
    }
    if (mode == F2Iceil) {
      local_30 = local_30 + 1.0;
    }
  }
  local_31 = 0;
  if ((-9.223372036854776e+18 <= local_30) && (local_31 = 0, local_30 < 9.223372036854776e+18)) {
    *p = (long)local_30;
    local_31 = 1;
  }
  return (uint)local_31;
}

Assistant:

int luaV_flttointeger (lua_Number n, lua_Integer *p, F2Imod mode) {
  lua_Number f = l_floor(n);
  if (n != f) {  /* not an integral value? */
    if (mode == F2Ieq) return 0;  /* fails if mode demands integral value */
    else if (mode == F2Iceil)  /* needs ceil? */
      f += 1;  /* convert floor to ceil (remember: n != f) */
  }
  return lua_numbertointeger(f, p);
}